

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O1

void __thiscall MCTS::Node<ConnectFourState>::~Node(Node<ConnectFourState> *this)

{
  pointer ppNVar1;
  Node<ConnectFourState> *this_00;
  pointer piVar2;
  pointer ppNVar3;
  
  ppNVar1 = (this->children).
            super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar3 = (this->children).
                 super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar3 != ppNVar1;
      ppNVar3 = ppNVar3 + 1) {
    this_00 = *ppNVar3;
    if (this_00 != (Node<ConnectFourState> *)0x0) {
      ~Node(this_00);
      operator_delete(this_00);
    }
  }
  ppNVar3 = (this->children).
            super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppNVar3 != (pointer)0x0) {
    operator_delete(ppNVar3);
  }
  piVar2 = (this->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

Node<State>::~Node()
{
	for (auto child: children) {
		delete child;
	}
}